

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_PreventExtensions(JSContext *ctx,JSValue obj)

{
  byte *pbVar1;
  int iVar2;
  
  if ((int)obj.tag != -1) {
    return 0;
  }
  if (*(short *)((long)obj.u.ptr + 6) != 0x29) {
    pbVar1 = (byte *)((long)obj.u.ptr + 5);
    *pbVar1 = *pbVar1 & 0xfe;
    return 1;
  }
  iVar2 = js_proxy_preventExtensions(ctx,obj);
  return iVar2;
}

Assistant:

int JS_PreventExtensions(JSContext *ctx, JSValueConst obj)
{
    JSObject *p;

    if (unlikely(JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT))
        return FALSE;
    p = JS_VALUE_GET_OBJ(obj);
    if (unlikely(p->class_id == JS_CLASS_PROXY))
        return js_proxy_preventExtensions(ctx, obj);
    p->extensible = FALSE;
    return TRUE;
}